

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

CharClass<char> * __thiscall
Centaurus::CharClass<char>::operator|=(CharClass<char> *this,CharClass<char> *cc)

{
  CharClass<char> *pCVar1;
  CharClass<char> local_38;
  CharClass<char> *local_18;
  CharClass<char> *cc_local;
  CharClass<char> *this_local;
  
  local_18 = cc;
  cc_local = this;
  operator|(&local_38,this,cc);
  pCVar1 = operator=(this,&local_38);
  ~CharClass(&local_38);
  return pCVar1;
}

Assistant:

CharClass<TCHAR>& operator|=(const CharClass<TCHAR>& cc)
    {
        return *this = *this | cc;
    }